

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O2

day_point __thiscall date::year_month_day::operator_cast_to_time_point(year_month_day *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  bVar1 = (this->m_).m_;
  iVar5 = (int)(this->y_).y_ - (uint)(bVar1 < 3);
  iVar2 = bVar1 - 3;
  if (bVar1 < 3) {
    iVar2 = bVar1 + 9;
  }
  iVar3 = iVar5 + -399;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  uVar4 = (iVar3 / 400) * -400 + iVar5;
  return (duration)
         (duration)
         ((((iVar2 * 0x99 + 2U) / 5 + (uint)(this->d_).d_ + (iVar3 / 400) * 0x23ab1 + (uVar4 >> 2) +
           uVar4 * 0x16d) - uVar4 / 100) + -0xafa6d);
}

Assistant:

CONSTCD11 inline year::operator int() const NOEXCEPT {return y_;}